

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O1

void __thiscall MIDIplay::noteOff(MIDIplay *this,size_t midCh,uint8_t note,bool forceNow)

{
  pointer pMVar1;
  pl_cell<MIDIplay::MIDIchannel::NoteInfo> *ppVar2;
  notes_iterator i;
  pl_cell<MIDIplay::MIDIchannel::NoteInfo> *ppVar3;
  
  pMVar1 = (this->m_midiChannels).
           super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>._M_impl
           .super__Vector_impl_data._M_start;
  ppVar2 = (pl_cell<MIDIplay::MIDIchannel::NoteInfo> *)&pMVar1[midCh].activenotes.endcell_;
  for (ppVar3 = pMVar1[midCh].activenotes.first_;
      (i.cell_ = ppVar2, ppVar3 != ppVar2 && (i.cell_ = ppVar3, (ppVar3->value).note != note));
      ppVar3 = (ppVar3->super_pl_basic_cell<MIDIplay::MIDIchannel::NoteInfo>).next) {
  }
  if (((i.cell_)->super_pl_basic_cell<MIDIplay::MIDIchannel::NoteInfo>).next !=
      (pl_cell<MIDIplay::MIDIchannel::NoteInfo> *)0x0) {
    if ((forceNow) || (((i.cell_)->value).ttl <= 0.0)) {
      noteUpdate(this,midCh,i,0x20,-1);
      return;
    }
    ((i.cell_)->value).isOnExtendedLifeTime = true;
  }
  return;
}

Assistant:

void MIDIplay::noteOff(size_t midCh, uint8_t note, bool forceNow)
{
    MIDIchannel &ch = m_midiChannels[midCh];
    MIDIchannel::notes_iterator i = ch.find_activenote(note);

    if(!i.is_end())
    {
        MIDIchannel::NoteInfo &ni = i->value;
        if(forceNow || ni.ttl <= 0)
            noteUpdate(midCh, i, Upd_Off);
        else
            ni.isOnExtendedLifeTime = true;
    }
}